

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis,float angle)

{
  float fVar1;
  float fVar2;
  rf_quaternion rVar3;
  rf_vec3 rVar4;
  float cosres;
  float sinres;
  undefined4 local_3c;
  float angle_local;
  undefined4 local_28;
  undefined4 uStack_24;
  rf_vec3 axis_local;
  rf_quaternion result;
  
  fVar1 = rf_vec3_len(axis);
  if ((fVar1 != 0.0) || (local_3c = angle, NAN(fVar1))) {
    local_3c = angle * 0.5;
  }
  rVar4 = rf_vec3_normalize(axis);
  fVar1 = sinf(local_3c);
  fVar2 = cosf(local_3c);
  local_28 = rVar4.x;
  uStack_24 = rVar4.y;
  rVar3.y = uStack_24 * fVar1;
  rVar3.x = local_28 * fVar1;
  rVar3.z = rVar4.z * fVar1;
  rVar3.w = fVar2;
  rVar3 = rf_quaternion_normalize(rVar3);
  return rVar3;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis, float angle)
{
    rf_quaternion result = {0.0f, 0.0f, 0.0f, 1.0f};

    if (rf_vec3_len(axis) != 0.0f)

        angle *= 0.5f;

    axis = rf_vec3_normalize(axis);

    float sinres = sinf(angle);
    float cosres = cosf(angle);

    result.x = axis.x * sinres;
    result.y = axis.y * sinres;
    result.z = axis.z * sinres;
    result.w = cosres;

    result = rf_quaternion_normalize(result);

    return result;
}